

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ExpressionLhs<const_unsigned_long_&>::endExpression
          (ExpressionLhs<const_unsigned_long_&> *this)

{
  unsigned_long uVar1;
  ResultBuilder *pRVar2;
  bool in_DL;
  string local_38;
  
  pRVar2 = this->m_rb;
  uVar1 = *this->m_lhs;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)(uVar1 != 0),in_DL);
  pRVar2 = ResultBuilder::setLhs(pRVar2,&local_38);
  pRVar2 = ResultBuilder::setResultType(pRVar2,uVar1 != 0);
  ResultBuilder::endExpression(pRVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }